

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O0

void decode_mt_init(AV1Decoder *pbi)

{
  int iVar1;
  AVxWorkerInterface *pAVar2;
  void *pvVar3;
  ThreadData *thread_data_00;
  long in_RDI;
  DecWorkerData *thread_data_1;
  int buf_size;
  int use_highbd;
  DecWorkerData *thread_data;
  AVxWorker *worker;
  int num_threads;
  int worker_idx;
  AVxWorkerInterface *winterface;
  AV1_COMMON *cm;
  size_t in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  long *in_stack_ffffffffffffffd0;
  ThreadData *in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffe0;
  int iVar4;
  
  pAVar2 = aom_get_worker_interface();
  if (*(int *)(in_RDI + 0xa128) == 0) {
    in_stack_ffffffffffffffe0 = *(int *)(in_RDI + 0x58d88);
    pvVar3 = aom_malloc(0x1b0042);
    *(void **)(in_RDI + 0xa120) = pvVar3;
    if (*(long *)(in_RDI + 0xa120) == 0) {
      aom_internal_error(*(aom_internal_error_info **)(in_RDI + 0x3b90),AOM_CODEC_MEM_ERROR,
                         "Failed to allocate pbi->tile_workers");
    }
    pvVar3 = aom_calloc(CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                        in_stack_ffffffffffffffc0);
    *(void **)(in_RDI + 0xa130) = pvVar3;
    if (*(long *)(in_RDI + 0xa130) == 0) {
      aom_internal_error(*(aom_internal_error_info **)(in_RDI + 0x3b90),AOM_CODEC_MEM_ERROR,
                         "Failed to allocate pbi->thread_data");
    }
    for (iVar4 = 0; iVar4 < in_stack_ffffffffffffffe0; iVar4 = iVar4 + 1) {
      in_stack_ffffffffffffffd8 = (ThreadData *)(*(long *)(in_RDI + 0xa120) + (long)iVar4 * 0x38);
      in_stack_ffffffffffffffd0 = (long *)(*(long *)(in_RDI + 0xa130) + (long)iVar4 * 0x1b0);
      (*pAVar2->init)((AVxWorker *)in_stack_ffffffffffffffd8);
      *(char **)(in_stack_ffffffffffffffd8->dcb).xd.plane = "aom tile worker";
      if ((iVar4 != 0) &&
         (iVar1 = (*pAVar2->reset)((AVxWorker *)in_stack_ffffffffffffffd8), iVar1 == 0)) {
        aom_internal_error((aom_internal_error_info *)(in_RDI + 0x5ff08),AOM_CODEC_ERROR,
                           "Tile decoder thread creation failed");
      }
      *(int *)(in_RDI + 0xa128) = *(int *)(in_RDI + 0xa128) + 1;
      if (iVar4 == 0) {
        *in_stack_ffffffffffffffd0 = in_RDI + 0xa140;
      }
      else {
        pvVar3 = aom_memalign((size_t)in_stack_ffffffffffffffd8,(size_t)in_stack_ffffffffffffffd0);
        *in_stack_ffffffffffffffd0 = (long)pvVar3;
        if (*in_stack_ffffffffffffffd0 == 0) {
          aom_internal_error(*(aom_internal_error_info **)(in_RDI + 0x3b90),AOM_CODEC_MEM_ERROR,
                             "Failed to allocate thread_data->td");
        }
        memset((void *)*in_stack_ffffffffffffffd0,0,0x3ebe0);
      }
      *(undefined4 *)(in_stack_ffffffffffffffd0 + 2) = 0;
      *(undefined4 *)(in_stack_ffffffffffffffd0 + 0x1c) = 0;
    }
  }
  iVar4 = 0x11040 << (*(byte *)(*(long *)(in_RDI + 0x9be8) + 0x4c) & 0x1f);
  for (iVar1 = 1; iVar1 < *(int *)(in_RDI + 0x58d88); iVar1 = iVar1 + 1) {
    thread_data_00 = (ThreadData *)(*(long *)(in_RDI + 0xa130) + (long)iVar1 * 0x1b0);
    if (*(int *)(*(long *)&(thread_data_00->dcb).xd + 0x3eb80) != iVar4) {
      av1_free_mc_tmp_buf(thread_data_00);
      allocate_mc_tmp_buf((AV1_COMMON *)CONCAT44(iVar1,in_stack_ffffffffffffffe0),
                          in_stack_ffffffffffffffd8,(int)((ulong)in_stack_ffffffffffffffd0 >> 0x20),
                          (int)in_stack_ffffffffffffffd0);
    }
  }
  return;
}

Assistant:

static inline void decode_mt_init(AV1Decoder *pbi) {
  AV1_COMMON *const cm = &pbi->common;
  const AVxWorkerInterface *const winterface = aom_get_worker_interface();
  int worker_idx;

  // Create workers and thread_data
  if (pbi->num_workers == 0) {
    const int num_threads = pbi->max_threads;
    CHECK_MEM_ERROR(cm, pbi->tile_workers,
                    aom_malloc(num_threads * sizeof(*pbi->tile_workers)));
    CHECK_MEM_ERROR(cm, pbi->thread_data,
                    aom_calloc(num_threads, sizeof(*pbi->thread_data)));

    for (worker_idx = 0; worker_idx < num_threads; ++worker_idx) {
      AVxWorker *const worker = &pbi->tile_workers[worker_idx];
      DecWorkerData *const thread_data = pbi->thread_data + worker_idx;

      winterface->init(worker);
      worker->thread_name = "aom tile worker";
      if (worker_idx != 0 && !winterface->reset(worker)) {
        aom_internal_error(&pbi->error, AOM_CODEC_ERROR,
                           "Tile decoder thread creation failed");
      }
      ++pbi->num_workers;

      if (worker_idx != 0) {
        // Allocate thread data.
        CHECK_MEM_ERROR(cm, thread_data->td,
                        aom_memalign(32, sizeof(*thread_data->td)));
        av1_zero(*thread_data->td);
      } else {
        // Main thread acts as a worker and uses the thread data in pbi
        thread_data->td = &pbi->td;
      }
      thread_data->error_info.error_code = AOM_CODEC_OK;
      thread_data->error_info.setjmp = 0;
    }
  }
  const int use_highbd = cm->seq_params->use_highbitdepth;
  const int buf_size = MC_TEMP_BUF_PELS << use_highbd;
  for (worker_idx = 1; worker_idx < pbi->max_threads; ++worker_idx) {
    DecWorkerData *const thread_data = pbi->thread_data + worker_idx;
    if (thread_data->td->mc_buf_size != buf_size) {
      av1_free_mc_tmp_buf(thread_data->td);
      allocate_mc_tmp_buf(cm, thread_data->td, buf_size, use_highbd);
    }
  }
}